

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::undoLast_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this)

{
  size_t *psVar1;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *plVar2;
  _List_node_base *p_Var3;
  undefined4 uVar4;
  int iVar5;
  double *pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  ulong uVar9;
  long lVar10;
  pair<int,_int> pVar11;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  if ((this->last_diff).
      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      _M_node._M_size != 0) {
    plVar2 = &this->last_diff;
    lVar10 = (long)(this->last_mem).first.first;
    if (-1 < lVar10) {
      *(pair<int,_int> *)
       (*(long *)&(this->A).
                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar10].
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data + (long)(this->last_mem).first.second * 8) =
           (this->last_mem).second;
    }
    for (p_Var13 = (plVar2->
                   super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
        p_Var13 != (_List_node_base *)plVar2; p_Var13 = p_Var13->_M_next) {
      pVar11 = Collimator::indexToPos(this->collimator,*(int *)&p_Var13[1]._M_next,this->angle);
      pdVar6 = (this->I).p[pVar11.first];
      pdVar6[(long)pVar11 >> 0x20] = pdVar6[(long)pVar11 >> 0x20] - (double)p_Var13[1]._M_prev;
      p_Var3 = p_Var13[1]._M_prev;
      uVar4 = *(undefined4 *)&p_Var13[1]._M_next;
      p_Var12 = (_List_node_base *)operator_new(0x20);
      uVar9 = (ulong)DAT_0012e5d0;
      *(undefined4 *)&p_Var12[1]._M_next = uVar4;
      p_Var12[1]._M_prev = (_List_node_base *)((ulong)p_Var3 ^ uVar9);
      std::__detail::_List_node_base::_M_hook(p_Var12);
      psVar1 = &(__return_storage_ptr__->
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    iVar5 = this->max_apertures;
    if (0 < (long)iVar5) {
      pdVar7 = (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      do {
        pdVar8[lVar10] = pdVar7[lVar10];
        lVar10 = lVar10 + 1;
      } while (iVar5 != lVar10);
    }
    (this->last_mem).first.first = -1;
    (this->last_mem).first.second = -1;
    (this->last_mem).second.first = -1;
    (this->last_mem).second.second = -1;
    p_Var13 = (plVar2->
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl._M_node.super__List_node_base._M_next;
    while (p_Var13 != (_List_node_base *)plVar2) {
      p_Var3 = p_Var13->_M_next;
      operator_delete(p_Var13);
      p_Var13 = p_Var3;
    }
    (this->last_diff).
    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
    (this->last_diff).
    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
    (this->last_diff).
    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    _M_node._M_size = 0;
    pdVar7 = (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar7) {
      (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar7;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

list <pair<int,double> > Station::undoLast () {
    list <pair<int,double> > undo_diff;
    //if (last_mem.first.first<0) {
      //return(undo_diff);
    //}
    pair<int,int> coord;
    
    if (last_diff.size()< 1) return(undo_diff);

    if (last_mem.first.first>=0)
      A[last_mem.first.first][last_mem.first.second] = last_mem.second;

    for (list<pair<int,double> >::iterator it=last_diff.begin();it!=last_diff.end();it++) {
      coord=collimator.indexToPos(it->first, angle);
      I(coord.first,coord.second) = I(coord.first,coord.second) - (it->second);
      undo_diff.push_back(make_pair(it->first, -(it->second)));
    }
    
    for (int i=0;i<max_apertures;i++) {
      intensity[i]=last_intensity[i];
    }

    last_mem= make_pair(make_pair(-1,-1), make_pair(-1,-1));
    last_diff.clear();
    last_intensity.clear();

    return(undo_diff);
  }